

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::AnnotatedEnumHandler::encode
          (AnnotatedEnumHandler *this,JsonCodec *codec,DynamicEnum input,Builder output)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  NullableValue<capnp::EnumSchema::Enumerant> *other;
  Enumerant *pEVar4;
  StringPtr *value;
  ArrayPtr<const_char> local_120;
  Fault local_110;
  Fault f;
  uint local_100;
  DebugExpression<unsigned_int> local_fc;
  undefined1 local_f8 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  Enumerant *e;
  Maybe<capnp::EnumSchema::Enumerant> local_b8;
  undefined1 local_70 [8];
  NullableValue<capnp::EnumSchema::Enumerant> _e1386;
  JsonCodec *codec_local;
  AnnotatedEnumHandler *this_local;
  DynamicEnum input_local;
  
  this_local = (AnnotatedEnumHandler *)input.schema.super_Schema.raw;
  input_local.schema.super_Schema.raw._0_2_ = input.value;
  _e1386.field_1._56_8_ = codec;
  DynamicEnum::getEnumerant(&local_b8,(DynamicEnum *)&this_local);
  other = kj::_::readMaybe<capnp::EnumSchema::Enumerant>(&local_b8);
  kj::_::NullableValue<capnp::EnumSchema::Enumerant>::NullableValue
            ((NullableValue<capnp::EnumSchema::Enumerant> *)local_70,other);
  kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe(&local_b8);
  pEVar4 = kj::_::NullableValue::operator_cast_to_Enumerant_((NullableValue *)local_70);
  if (pEVar4 == (Enumerant *)0x0) {
    uVar2 = DynamicEnum::getRaw((DynamicEnum *)&this_local);
    json::Value::Builder::setNumber(&output,(double)uVar2);
  }
  else {
    _kjCondition._32_8_ =
         kj::_::NullableValue<capnp::EnumSchema::Enumerant>::operator*
                   ((NullableValue<capnp::EnumSchema::Enumerant> *)local_70);
    local_100 = EnumSchema::Enumerant::getIndex((Enumerant *)_kjCondition._32_8_);
    local_fc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_100);
    f.exception = (Exception *)kj::Array<kj::StringPtr>::size(&this->valueToName);
    kj::_::DebugExpression<unsigned_int>::operator<
              ((DebugComparison<unsigned_int,_unsigned_long> *)local_f8,&local_fc,
               (unsigned_long *)&f);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&>
                (&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x56b,FAILED,"e.getIndex() < valueToName.size()","_kjCondition,",
                 (DebugComparison<unsigned_int,_unsigned_long> *)local_f8);
      kj::_::Debug::Fault::fatal(&local_110);
    }
    uVar3 = EnumSchema::Enumerant::getIndex((Enumerant *)_kjCondition._32_8_);
    value = kj::Array<kj::StringPtr>::operator[](&this->valueToName,(ulong)uVar3);
    Text::Reader::Reader((Reader *)&local_120,value);
    json::Value::Builder::setString(&output,(Reader)local_120);
  }
  kj::_::NullableValue<capnp::EnumSchema::Enumerant>::~NullableValue
            ((NullableValue<capnp::EnumSchema::Enumerant> *)local_70);
  return;
}

Assistant:

void encode(const JsonCodec& codec, DynamicEnum input, JsonValue::Builder output) const override {
    KJ_IF_SOME(e, input.getEnumerant()) {
      KJ_ASSERT(e.getIndex() < valueToName.size());
      output.setString(valueToName[e.getIndex()]);
    } else {
      output.setNumber(input.getRaw());
    }